

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_node
          (NodeLoader15 *this,instance_node__AttributeData *attributeData)

{
  long *plVar1;
  byte bVar2;
  uint *in_RSI;
  instance_node__AttributeData *in_RDI;
  instance_node__AttributeData attrData;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  instance_node__AttributeData *in_stack_fffffffffffffe00;
  uint local_1f8 [118];
  undefined8 local_20;
  undefined8 local_18;
  uint *local_10;
  
  local_10 = in_RSI;
  instance_node__AttributeData::instance_node__AttributeData(in_stack_fffffffffffffe00);
  local_1f8[0] = 0;
  local_20 = *(undefined8 *)(local_10 + 0x76);
  local_18 = *(undefined8 *)(local_10 + 0x78);
  if ((*local_10 & 2) == 2) {
    COLLADABU::URI::operator=
              ((URI *)in_RDI,(URI *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    local_1f8[0] = local_1f8[0] | 2;
  }
  if ((*local_10 & 1) == 1) {
    COLLADABU::URI::operator=
              ((URI *)in_RDI,(URI *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    local_1f8[0] = local_1f8[0] | 1;
  }
  plVar1 = *(long **)&(in_RDI->proxy).mUriString.field_2;
  bVar2 = (**(code **)(*plVar1 + 0x100))(plVar1,local_1f8);
  instance_node__AttributeData::~instance_node__AttributeData(in_RDI);
  return (bool)(bVar2 & 1);
}

Assistant:

bool NodeLoader15::begin__instance_node( const COLLADASaxFWL15::instance_node__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_node(attributeData));
COLLADASaxFWL::instance_node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT ) {
    attrData.proxy = attributeData.proxy;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT;
}
return mLoader->begin__instance_node(attrData);
}